

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrBodyJointLocationHTC *value)

{
  ValidateXrFlagsResult VVar1;
  string local_248 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  allocator local_209;
  string local_208 [32];
  string local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream oss_enum;
  ValidateXrFlagsResult space_location_flags_result;
  XrResult xr_result;
  XrBodyJointLocationHTC *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if (check_members) {
    VVar1 = ValidateXrSpaceLocationFlags(value->locationFlags);
    if (VVar1 == VALIDATE_XR_FLAGS_INVALID) {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      std::operator<<((ostream *)local_1b8,
                      "XrBodyJointLocationHTC invalid member XrSpaceLocationFlags \"locationFlags\" flag value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_1e8);
      std::operator<<((ostream *)local_1b8,local_1e8);
      std::__cxx11::string::~string(local_1e8);
      std::operator<<((ostream *)local_1b8," contains illegal bit");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_208,"VUID-XrBodyJointLocationHTC-locationFlags-parameter",&local_209);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_228,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_208,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_228,local_248);
      std::__cxx11::string::~string((string *)local_248);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_228);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
    }
    else {
      instance_info_local._4_4_ = XR_SUCCESS;
    }
  }
  else {
    instance_info_local._4_4_ = XR_SUCCESS;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrBodyJointLocationHTC* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult space_location_flags_result = ValidateXrSpaceLocationFlags(value->locationFlags);
    // Valid flags available, so it must be invalid to fail.
    if (VALIDATE_XR_FLAGS_INVALID == space_location_flags_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrBodyJointLocationHTC invalid member XrSpaceLocationFlags \"locationFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->locationFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationHTC-locationFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}